

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppTVar3;
  TestInfo *pTVar4;
  pointer piVar5;
  ostream *poVar6;
  pointer ppTVar7;
  int iVar8;
  TimeInMillis ms;
  TimeInMillis ms_00;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  string kIndent;
  string kTestsuite;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"testsuite","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90.field_2._M_allocated_capacity._0_4_ = 0x20202020;
  local_90.field_2._M_allocated_capacity._4_2_ = 0x2020;
  local_90._M_string_length = 6;
  local_90.field_2._M_local_buf[6] = '\0';
  paVar1 = &local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x20202020;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_allocated_capacity._4_4_ =
       local_b8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar1->_M_local_buf,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                             local_b8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,(test_suite->name_)._M_dataplus._M_p,&local_91);
  OutputJsonKey(stream,&local_50,&local_b8,&local_70,&local_90,true);
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                             local_b8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"tests","");
  ppTVar7 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar3 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar7 == ppTVar3) {
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    do {
      uVar11 = (*ppTVar7)->is_in_another_shard_ ^ 1;
      if ((*ppTVar7)->matches_filter_ == false) {
        uVar11 = 0;
      }
      iVar8 = iVar8 + uVar11;
      ppTVar7 = ppTVar7 + 1;
    } while (ppTVar7 != ppTVar3);
  }
  OutputJsonKey(stream,&local_50,&local_b8,iVar8,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                             local_b8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (FLAGS_gtest_list_tests == '\0') {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"failures","");
    iVar8 = TestSuite::failed_test_count(test_suite);
    OutputJsonKey(stream,&local_50,&local_b8,iVar8,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                               local_b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"disabled","");
    iVar8 = 0;
    for (ppTVar7 = (test_suite->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar7 !=
        (test_suite->test_info_list_).
        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar7 = ppTVar7 + 1) {
      pTVar4 = *ppTVar7;
      uVar11 = 0;
      if ((pTVar4->matches_filter_ == true) && ((pTVar4->is_in_another_shard_ & 1U) == 0)) {
        uVar11 = (uint)pTVar4->is_disabled_;
      }
      iVar8 = iVar8 + uVar11;
    }
    OutputJsonKey(stream,&local_50,&local_b8,iVar8,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                               local_b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"errors","");
    OutputJsonKey(stream,&local_50,&local_b8,0,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                               local_b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_70,(internal *)test_suite->start_timestamp_,ms);
    OutputJsonKey(stream,&local_50,&local_b8,&local_70,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                               local_b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_70,(internal *)test_suite->elapsed_time_,ms_00);
    OutputJsonKey(stream,&local_50,&local_b8,&local_70,&local_90,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                               local_b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    TestPropertiesAsJson(&local_b8,&test_suite->ad_hoc_test_result_,&local_90);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                               local_b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\": [\n",5);
  ppTVar7 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(test_suite->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7) >> 3)) {
    lVar12 = 0;
    bVar9 = false;
    do {
      piVar5 = (test_suite->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0xffffffff;
      if (lVar12 < (int)((ulong)((long)(test_suite->test_indices_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar5) >> 2)) {
        uVar11 = piVar5[lVar12];
      }
      if ((ppTVar7[uVar11]->matches_filter_ == true) &&
         ((ppTVar7[uVar11]->is_in_another_shard_ & 1U) == 0)) {
        bVar10 = true;
        if (bVar9) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
          bVar10 = bVar9;
        }
        piVar5 = (test_suite->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0xffffffff;
        if (lVar12 < (int)((ulong)((long)(test_suite->test_indices_).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar5) >> 2)) {
          uVar11 = piVar5[lVar12];
        }
        OutputJsonTestInfo(stream,(test_suite->name_)._M_dataplus._M_p,
                           (test_suite->test_info_list_).
                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11]);
        bVar9 = bVar10;
      }
      lVar12 = lVar12 + 1;
      ppTVar7 = (test_suite->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(test_suite->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7
                                   ) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  paVar1 = &local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_4_ = 0x20202020;
  local_b8._M_string_length = 4;
  local_b8.field_2._M_allocated_capacity._4_4_ =
       local_b8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,paVar1->_M_local_buf,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                             local_b8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT17(local_90.field_2._M_local_buf[7],
                             CONCAT16(local_90.field_2._M_local_buf[6],
                                      CONCAT24(local_90.field_2._M_allocated_capacity._4_2_,
                                               local_90.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}